

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::AddTestsForDashboardType(cmCTest *this,string *targ)

{
  bool bVar1;
  string *targ_local;
  cmCTest *this_local;
  
  bVar1 = std::operator==(targ,"Experimental");
  if (bVar1) {
    SetTestModel(this,0);
    SetTest(this,"Start",true);
    SetTest(this,"Configure",true);
    SetTest(this,"Build",true);
    SetTest(this,"Test",true);
    SetTest(this,"Coverage",true);
    SetTest(this,"Submit",true);
  }
  else {
    bVar1 = std::operator==(targ,"ExperimentalStart");
    if (bVar1) {
      SetTestModel(this,0);
      SetTest(this,"Start",true);
    }
    else {
      bVar1 = std::operator==(targ,"ExperimentalUpdate");
      if (bVar1) {
        SetTestModel(this,0);
        SetTest(this,"Update",true);
      }
      else {
        bVar1 = std::operator==(targ,"ExperimentalConfigure");
        if (bVar1) {
          SetTestModel(this,0);
          SetTest(this,"Configure",true);
        }
        else {
          bVar1 = std::operator==(targ,"ExperimentalBuild");
          if (bVar1) {
            SetTestModel(this,0);
            SetTest(this,"Build",true);
          }
          else {
            bVar1 = std::operator==(targ,"ExperimentalTest");
            if (bVar1) {
              SetTestModel(this,0);
              SetTest(this,"Test",true);
            }
            else {
              bVar1 = std::operator==(targ,"ExperimentalMemCheck");
              if ((bVar1) || (bVar1 = std::operator==(targ,"ExperimentalPurify"), bVar1)) {
                SetTestModel(this,0);
                SetTest(this,"MemCheck",true);
              }
              else {
                bVar1 = std::operator==(targ,"ExperimentalCoverage");
                if (bVar1) {
                  SetTestModel(this,0);
                  SetTest(this,"Coverage",true);
                }
                else {
                  bVar1 = std::operator==(targ,"ExperimentalSubmit");
                  if (bVar1) {
                    SetTestModel(this,0);
                    SetTest(this,"Submit",true);
                  }
                  else {
                    bVar1 = std::operator==(targ,"Continuous");
                    if (bVar1) {
                      SetTestModel(this,2);
                      SetTest(this,"Start",true);
                      SetTest(this,"Update",true);
                      SetTest(this,"Configure",true);
                      SetTest(this,"Build",true);
                      SetTest(this,"Test",true);
                      SetTest(this,"Coverage",true);
                      SetTest(this,"Submit",true);
                    }
                    else {
                      bVar1 = std::operator==(targ,"ContinuousStart");
                      if (bVar1) {
                        SetTestModel(this,2);
                        SetTest(this,"Start",true);
                      }
                      else {
                        bVar1 = std::operator==(targ,"ContinuousUpdate");
                        if (bVar1) {
                          SetTestModel(this,2);
                          SetTest(this,"Update",true);
                        }
                        else {
                          bVar1 = std::operator==(targ,"ContinuousConfigure");
                          if (bVar1) {
                            SetTestModel(this,2);
                            SetTest(this,"Configure",true);
                          }
                          else {
                            bVar1 = std::operator==(targ,"ContinuousBuild");
                            if (bVar1) {
                              SetTestModel(this,2);
                              SetTest(this,"Build",true);
                            }
                            else {
                              bVar1 = std::operator==(targ,"ContinuousTest");
                              if (bVar1) {
                                SetTestModel(this,2);
                                SetTest(this,"Test",true);
                              }
                              else {
                                bVar1 = std::operator==(targ,"ContinuousMemCheck");
                                if ((bVar1) ||
                                   (bVar1 = std::operator==(targ,"ContinuousPurify"), bVar1)) {
                                  SetTestModel(this,2);
                                  SetTest(this,"MemCheck",true);
                                }
                                else {
                                  bVar1 = std::operator==(targ,"ContinuousCoverage");
                                  if (bVar1) {
                                    SetTestModel(this,2);
                                    SetTest(this,"Coverage",true);
                                  }
                                  else {
                                    bVar1 = std::operator==(targ,"ContinuousSubmit");
                                    if (bVar1) {
                                      SetTestModel(this,2);
                                      SetTest(this,"Submit",true);
                                    }
                                    else {
                                      bVar1 = std::operator==(targ,"Nightly");
                                      if (bVar1) {
                                        SetTestModel(this,1);
                                        SetTest(this,"Start",true);
                                        SetTest(this,"Update",true);
                                        SetTest(this,"Configure",true);
                                        SetTest(this,"Build",true);
                                        SetTest(this,"Test",true);
                                        SetTest(this,"Coverage",true);
                                        SetTest(this,"Submit",true);
                                      }
                                      else {
                                        bVar1 = std::operator==(targ,"NightlyStart");
                                        if (bVar1) {
                                          SetTestModel(this,1);
                                          SetTest(this,"Start",true);
                                        }
                                        else {
                                          bVar1 = std::operator==(targ,"NightlyUpdate");
                                          if (bVar1) {
                                            SetTestModel(this,1);
                                            SetTest(this,"Update",true);
                                          }
                                          else {
                                            bVar1 = std::operator==(targ,"NightlyConfigure");
                                            if (bVar1) {
                                              SetTestModel(this,1);
                                              SetTest(this,"Configure",true);
                                            }
                                            else {
                                              bVar1 = std::operator==(targ,"NightlyBuild");
                                              if (bVar1) {
                                                SetTestModel(this,1);
                                                SetTest(this,"Build",true);
                                              }
                                              else {
                                                bVar1 = std::operator==(targ,"NightlyTest");
                                                if (bVar1) {
                                                  SetTestModel(this,1);
                                                  SetTest(this,"Test",true);
                                                }
                                                else {
                                                  bVar1 = std::operator==(targ,"NightlyMemCheck");
                                                  if ((bVar1) ||
                                                     (bVar1 = std::operator==(targ,"NightlyPurify"),
                                                     bVar1)) {
                                                    SetTestModel(this,1);
                                                    SetTest(this,"MemCheck",true);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(targ,"NightlyCoverage");
                                                    if (bVar1) {
                                                      SetTestModel(this,1);
                                                      SetTest(this,"Coverage",true);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(targ,"NightlySubmit");
                                                      if (bVar1) {
                                                        SetTestModel(this,1);
                                                        SetTest(this,"Submit",true);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(targ,"MemoryCheck");
                                                        if (bVar1) {
                                                          SetTestModel(this,0);
                                                          SetTest(this,"Start",true);
                                                          SetTest(this,"Configure",true);
                                                          SetTest(this,"Build",true);
                                                          SetTest(this,"MemCheck",true);
                                                          SetTest(this,"Coverage",true);
                                                          SetTest(this,"Submit",true);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(targ,
                                                  "NightlyMemoryCheck");
                                                  if (!bVar1) {
                                                    return false;
                                                  }
                                                  SetTestModel(this,1);
                                                  SetTest(this,"Start",true);
                                                  SetTest(this,"Update",true);
                                                  SetTest(this,"Configure",true);
                                                  SetTest(this,"Build",true);
                                                  SetTest(this,"MemCheck",true);
                                                  SetTest(this,"Coverage",true);
                                                  SetTest(this,"Submit",true);
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmCTest::AddTestsForDashboardType(std::string &targ)
{
  if ( targ == "Experimental" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ExperimentalStart" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    }
  else if ( targ == "ExperimentalUpdate" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Update");
    }
  else if ( targ == "ExperimentalConfigure" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Configure");
    }
  else if ( targ == "ExperimentalBuild" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Build");
    }
  else if ( targ == "ExperimentalTest" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Test");
    }
  else if ( targ == "ExperimentalMemCheck"
            || targ == "ExperimentalPurify" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ExperimentalCoverage" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Coverage");
    }
  else if ( targ == "ExperimentalSubmit" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Submit");
    }
  else if ( targ == "Continuous" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ContinuousStart" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    }
  else if ( targ == "ContinuousUpdate" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Update");
    }
  else if ( targ == "ContinuousConfigure" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Configure");
    }
  else if ( targ == "ContinuousBuild" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Build");
    }
  else if ( targ == "ContinuousTest" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Test");
    }
  else if ( targ == "ContinuousMemCheck"
        || targ == "ContinuousPurify" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ContinuousCoverage" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Coverage");
    }
  else if ( targ == "ContinuousSubmit" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Submit");
    }
  else if ( targ == "Nightly" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyStart" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    }
  else if ( targ == "NightlyUpdate" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Update");
    }
  else if ( targ == "NightlyConfigure" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Configure");
    }
  else if ( targ == "NightlyBuild" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Build");
    }
  else if ( targ == "NightlyTest" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Test");
    }
  else if ( targ == "NightlyMemCheck"
            || targ == "NightlyPurify" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("MemCheck");
    }
  else if ( targ == "NightlyCoverage" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Coverage");
    }
  else if ( targ == "NightlySubmit" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Submit");
    }
  else if ( targ == "MemoryCheck" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyMemoryCheck" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else
    {
    return false;
    }
  return true;
}